

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall SQVM::Raise_Error(SQVM *this,SQChar *s,...)

{
  SQSharedState *this_00;
  char in_AL;
  SQChar *pSVar1;
  SQString *x;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  size_t local_40;
  SQInteger buffersize;
  va_list vl;
  SQChar *s_local;
  SQVM *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = local_f8;
  vl[0]._0_8_ = &stack0x00000008;
  buffersize._4_4_ = 0x30;
  buffersize._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_40 = strlen(s);
  local_40 = local_40 + 100;
  pSVar1 = SQSharedState::GetScratchPad(this->_sharedstate,local_40);
  vsnprintf(pSVar1,local_40,s,&buffersize);
  this_00 = this->_sharedstate;
  pSVar1 = SQSharedState::GetScratchPad(this_00,-1);
  x = SQString::Create(this_00,pSVar1,-1);
  ::SQObjectPtr::operator=(&this->_lasterror,x);
  return;
}

Assistant:

void SQVM::Raise_Error(const SQChar *s, ...)
{
    va_list vl;
    va_start(vl, s);
    SQInteger buffersize = (SQInteger)scstrlen(s)+(NUMBER_MAX_CHAR*2);
    scvsprintf(_sp(sq_rsl(buffersize)),buffersize, s, vl);
    va_end(vl);
    _lasterror = SQString::Create(_ss(this),_spval,-1);
}